

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O1

void __thiscall
QPlainTextEditPrivate::setTopBlock
          (QPlainTextEditPrivate *this,int blockNumber,int lineNumber,int dx)

{
  QWidget *this_00;
  long *plVar1;
  QScrollBar *this_01;
  QWidget *this_02;
  QWidgetData *pQVar2;
  qreal qVar3;
  qreal qVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  LayoutDirection LVar9;
  undefined8 uVar10;
  long in_FS_OFFSET;
  double dVar11;
  undefined8 local_80;
  undefined8 local_78;
  int local_6c;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined8 *puStack_50;
  int *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  if (blockNumber < 1) {
    blockNumber = 0;
  }
  iVar8 = 0;
  if (0 < lineNumber) {
    iVar8 = lineNumber;
  }
  QWidgetTextControl::document((QWidgetTextControl *)this->control);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::findBlockByNumber((int)&local_68);
  iVar6 = QTextBlock::firstLineNumber();
  iVar6 = iVar6 + iVar8;
  iVar7 = QAbstractSlider::maximum
                    (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider);
  if (iVar7 < iVar6) {
    QTextDocument::findBlockByLineNumber((int)&local_58);
    local_68 = local_58;
    puStack_60 = (undefined1 *)CONCAT44(puStack_60._4_4_,puStack_50._0_4_);
    blockNumber = QTextBlock::blockNumber();
    iVar8 = QTextBlock::firstLineNumber();
    iVar8 = iVar7 - iVar8;
  }
  QAbstractSlider::setValue
            (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,iVar6);
  if (((dx != 0) || (blockNumber != this->control->topBlock)) || (iVar8 != this->topLine)) {
    if ((((this->super_QAbstractScrollAreaPrivate).viewport)->data->widget_attributes & 0x8400) ==
        0x8000) {
      QTextDocument::findBlockByNumber((int)&local_58);
      cVar5 = QTextBlock::isValid();
      iVar6 = 0;
      if (cVar5 != '\0') {
        plVar1 = *(long **)(*(long *)&this_00->field_0x8 + 800);
        (**(code **)(*plVar1 + 0x80))(&local_58,plVar1,&local_68);
        qVar3 = verticalOffset(this,this->control->topBlock,this->topLine);
        dVar11 = this->topLineFracture;
        qVar4 = verticalOffset(this,blockNumber,iVar8);
        dVar11 = ((qVar3 + dVar11) - (double)puStack_50) - qVar4;
        iVar6 = (int)dVar11;
        this->topLineFracture = dVar11 - (double)(int)dVar11;
      }
      this->control->topBlock = blockNumber;
      this->topLine = iVar8;
      this_01 = (this->super_QAbstractScrollAreaPrivate).vbar;
      iVar7 = QTextBlock::firstLineNumber();
      QAbstractSlider::setValue(&this_01->super_QAbstractSlider,iVar8 + iVar7);
      this_02 = (this->super_QAbstractScrollAreaPrivate).viewport;
      if (dx == 0 && iVar6 == 0) {
        QWidget::update(this_02);
        this->topLineFracture = 0.0;
      }
      else {
        LVar9 = QWidget::layoutDirection(this_00);
        iVar8 = -dx;
        if (LVar9 != RightToLeft) {
          iVar8 = dx;
        }
        QWidget::scroll(this_02,iVar8,iVar6);
        uVar10 = QGuiApplication::inputMethod();
        QInputMethod::update(uVar10,0x4002);
      }
      pQVar2 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
      local_78 = CONCAT44((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i,
                          (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i);
      puStack_50 = &local_80;
      local_80 = 0;
      local_48 = &local_6c;
      local_58 = (undefined1 *)0x0;
      local_6c = iVar6;
      QMetaObject::activate(&this_00->super_QObject,&QPlainTextEdit::staticMetaObject,6,&local_58);
    }
    else {
      this->control->topBlock = blockNumber;
      this->topLine = iVar8;
      this->topLineFracture = 0.0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPlainTextEditPrivate::setTopBlock(int blockNumber, int lineNumber, int dx)
{
    Q_Q(QPlainTextEdit);
    blockNumber = qMax(0, blockNumber);
    lineNumber = qMax(0, lineNumber);
    QTextDocument *doc = control->document();
    QTextBlock block = doc->findBlockByNumber(blockNumber);

    int newTopLine = block.firstLineNumber() + lineNumber;
    int maxTopLine = vbar->maximum();

    if (newTopLine > maxTopLine) {
        block = doc->findBlockByLineNumber(maxTopLine);
        blockNumber = block.blockNumber();
        lineNumber = maxTopLine - block.firstLineNumber();
    }

    vbar->setValue(newTopLine);

    if (!dx && blockNumber == control->topBlock && lineNumber == topLine)
        return;

    if (viewport->updatesEnabled() && viewport->isVisible()) {
        int dy = 0;
        if (doc->findBlockByNumber(control->topBlock).isValid()) {
            qreal realdy = -q->blockBoundingGeometry(block).y()
                    + verticalOffset() - verticalOffset(blockNumber, lineNumber);
            dy = (int)realdy;
            topLineFracture = realdy - dy;
        }
        control->topBlock = blockNumber;
        topLine = lineNumber;

        vbar->setValue(block.firstLineNumber() + lineNumber);

        if (dx || dy) {
            viewport->scroll(q->isRightToLeft() ? -dx : dx, dy);
            QGuiApplication::inputMethod()->update(Qt::ImCursorRectangle | Qt::ImAnchorRectangle);
        } else {
            viewport->update();
            topLineFracture = 0;
        }
        emit q->updateRequest(viewport->rect(), dy);
    } else {
        control->topBlock = blockNumber;
        topLine = lineNumber;
        topLineFracture = 0;
    }

}